

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lanli.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  size_t sVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  undefined8 *puVar5;
  long *plVar6;
  undefined8 uVar7;
  clock_t cVar8;
  clock_t cVar9;
  double dVar10;
  double elapsed;
  lanli_document *document;
  void *opaque;
  lanli_callback callback;
  lanli_buffer *ob;
  lanli_buffer *ib;
  FILE *file;
  clock_t t2;
  clock_t t1;
  option_data data;
  char **argv_local;
  int argc_local;
  
  ib = _stdin;
  opaque = (void *)0x0;
  t1 = (clock_t)*argv;
  data.basename._0_4_ = 0;
  data.basename._4_4_ = 0;
  data.done = 0x400;
  data.show_time = 0;
  data.iunit = 0x40;
  data.ounit = 0;
  data.filename._0_4_ = 0;
  data.filename._4_4_ = 3;
  data.callback = CALLBACK_STRICT_POST;
  data.flags = 0;
  data.levels = 0x10;
  data.max_nesting = 8;
  data.max_attributes = (size_t)argv;
  iVar2 = parse_options(argc,argv,parse_short_option,parse_long_option,parse_argument,&t1);
  if ((int)data.basename == 0) {
    if (iVar2 == 0) {
      argv_local._4_4_ = 1;
    }
    else if ((data.ounit == 0) ||
            (ib = (lanli_buffer *)fopen((char *)data.ounit,"r"), sVar1 = data.ounit,
            __stream = _stderr, (FILE *)ib != (FILE *)0x0)) {
      puVar5 = (undefined8 *)lanli_buffer_new(data._8_8_);
      iVar2 = lanli_buffer_putf(puVar5,ib);
      if (iVar2 == 0) {
        if (ib != _stdin) {
          fclose((FILE *)ib);
        }
        switch(data.filename._0_4_) {
        case 0:
          opaque = lanli_callback_strict_post;
          break;
        case 1:
          opaque = callback_accept;
          break;
        case 2:
          opaque = callback_escape;
          break;
        case 3:
          opaque = callback_skip;
          break;
        case 4:
          opaque = callback_ignore;
          break;
        case 5:
          opaque = callback_verbatim;
        }
        plVar6 = (long *)lanli_buffer_new(data.iunit);
        uVar7 = lanli_document_new(opaque,0,data.filename._4_4_,data._40_8_,data.levels,
                                   data.max_nesting);
        cVar8 = clock();
        lanli_document_render(uVar7,plVar6,*puVar5,puVar5[1]);
        cVar9 = clock();
        lanli_buffer_free(puVar5);
        lanli_document_free(uVar7);
        if ((plVar6[1] != 0) && (*(char *)(*plVar6 + plVar6[1] + -1) != '\n')) {
          lanli_buffer_putc(plVar6,10);
        }
        fwrite((void *)*plVar6,1,plVar6[1],_stdout);
        lanli_buffer_free(plVar6);
        iVar2 = ferror(_stdout);
        if (iVar2 == 0) {
          if (data.basename._4_4_ != 0) {
            if ((cVar8 == -1) || (cVar9 == -1)) {
              fprintf(_stderr,"Failed to get the time.\n");
              return 1;
            }
            dVar10 = (double)(cVar9 - cVar8) / 1000000.0;
            if (1.0 <= dVar10) {
              fprintf(_stderr,"Time spent on rendering: %6.3f s.\n",dVar10);
            }
            else {
              fprintf(_stderr,"Time spent on rendering: %7.2f ms.\n",dVar10 * 1000.0);
            }
          }
          argv_local._4_4_ = 0;
        }
        else {
          fprintf(_stderr,"I/O errors found while writing output.\n");
          argv_local._4_4_ = 5;
        }
      }
      else {
        fprintf(_stderr,"I/O errors found while reading input.\n");
        argv_local._4_4_ = 5;
      }
    }
    else {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(__stream,"Unable to open input file \"%s\": %s\n",sVar1,pcVar4);
      argv_local._4_4_ = 5;
    }
  }
  else {
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
  struct option_data data;
  clock_t t1, t2;
  FILE *file = stdin;
  lanli_buffer *ib, *ob;
  lanli_callback callback = NULL;
  void *opaque = NULL;
  lanli_document *document;

  /* Parse options */
  data.basename = argv[0];
  data.done = 0;
  data.show_time = 0;
  data.iunit = DEF_IUNIT;
  data.ounit = DEF_OUNIT;
  data.filename = NULL;
  data.callback = DEF_CALLBACK;
  data.flags = DEF_FLAGS;
  data.levels = DEF_LEVELS;
  data.max_nesting = DEF_MAX_NESTING;
  data.max_attributes = DEF_MAX_ATTRIBUTES;

  argc = parse_options(argc, argv, parse_short_option, parse_long_option, parse_argument, &data);
  if (data.done) return 0;
  if (!argc) return 1;

  /* Open input file, if needed */
  if (data.filename) {
    file = fopen(data.filename, "r");
    if (!file) {
      fprintf(stderr, "Unable to open input file \"%s\": %s\n", data.filename, strerror(errno));
      return 5;
    }
  }

  /* Read everything */
  ib = lanli_buffer_new(data.iunit);

  if (lanli_buffer_putf(ib, file)) {
    fprintf(stderr, "I/O errors found while reading input.\n");
    return 5;
  }

  if (file != stdin) fclose(file);

  /* Obtain the callback */
  switch (data.callback) {
    case CALLBACK_STRICT_POST:
      callback = lanli_callback_strict_post;
      break;
    case CALLBACK_ACCEPT:
      callback = callback_accept;
      break;
    case CALLBACK_ESCAPE:
      callback = callback_escape;
      break;
    case CALLBACK_SKIP:
      callback = callback_skip;
      break;
    case CALLBACK_IGNORE:
      callback = callback_ignore;
      break;
    case CALLBACK_VERBATIM:
      callback = callback_verbatim;
      break;
  };

  /* Sanitize input HTML */
  ob = lanli_buffer_new(data.ounit);
  document = lanli_document_new(callback, opaque, data.flags, data.levels, data.max_nesting, data.max_attributes);

  t1 = clock();
  lanli_document_render(document, ob, ib->data, ib->size);
  t2 = clock();

  /* Cleanup */
  lanli_buffer_free(ib);
  lanli_document_free(document);

  /* Write the result to stdout */
  if (ob->size && ob->data[ob->size-1] != '\n')
    lanli_buffer_putc(ob, '\n');

  (void)fwrite(ob->data, 1, ob->size, stdout);
  lanli_buffer_free(ob);

  if (ferror(stdout)) {
    fprintf(stderr, "I/O errors found while writing output.\n");
    return 5;
  }

  /* Show rendering time */
  if (data.show_time) {
    if (t1 == -1 || t2 == -1) {
      fprintf(stderr, "Failed to get the time.\n");
      return 1;
    }

    double elapsed = (double)(t2 - t1) / CLOCKS_PER_SEC;
    if (elapsed < 1)
      fprintf(stderr, "Time spent on rendering: %7.2f ms.\n", elapsed*1e3);
    else
      fprintf(stderr, "Time spent on rendering: %6.3f s.\n", elapsed);
  }

  return 0;
}